

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoke_test.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *ppBVar1;
  pointer *ppiVar2;
  iterator iVar3;
  iterator __position;
  bool bVar4;
  int iVar5;
  int iVar6;
  _List_node_base *p_Var7;
  QueuePolicy *q_policy;
  Link *l;
  vector<int,_std::allocator<int>_> *this;
  int iVar8;
  ulong uVar9;
  uint j;
  bool help;
  int local_1a00;
  int nblocks;
  _List_node_base *local_19f8;
  _List_node_base *local_19f0;
  _List_node_base *local_19e8;
  _List_node_base *local_19e0;
  _List_node_base *local_19d8;
  int in_memory;
  int threads;
  string local_19c8;
  vector<int,_std::allocator<int>_> gids;
  BlockID neighbor;
  undefined1 local_1978 [16];
  pointer pcStack_1968;
  size_t local_1960;
  vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> vStack_1958;
  communicator world;
  LoadBlock local_1928;
  SaveBlock local_1908;
  DestroyBlock local_18e8;
  CreateBlock local_18c8;
  string prefix;
  string local_1880;
  string local_1860;
  Options ops;
  environment env;
  string local_1800;
  string local_17e0;
  string local_17c0;
  string local_17a0;
  communicator local_1780;
  _Any_data local_1768;
  code *local_1758;
  undefined8 uStack_1750;
  FileStorage storage;
  _Any_data local_16c8;
  code *local_16b8;
  code *pcStack_16b0;
  _Any_data local_16a8;
  code *local_1698;
  code *pcStack_1690;
  _Any_data local_1688;
  code *local_1678;
  code *pcStack_1670;
  Master master;
  
  storage.super_ExternalStorage._vptr_ExternalStorage._0_4_ = argc;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)argv;
  MPI_Init_thread(&storage,&master,1);
  world.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  world.rank_ = 0;
  world.size_ = 1;
  world.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(world.comm_.data);
  nblocks = 0x80;
  threads = 4;
  in_memory = 8;
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&prefix,"./DIY.XXXXXX","");
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)&master,"blocks","");
  storage.super_ExternalStorage._vptr_ExternalStorage =
       (_func_int **)
       &storage.filename_templates_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)&storage,"number of blocks","");
  opts::Option<int>((opts *)&local_19d8,'b',(string *)&master,&nblocks,(string *)&storage);
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = local_19d8;
  local_19d8 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  neighbor = (BlockID)local_1978;
  std::__cxx11::string::_M_construct<char_const*>((string *)&neighbor,"thread","");
  local_19c8._M_dataplus._M_p = (pointer)&local_19c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_19c8,"number of threads","");
  opts::Option<int>((opts *)&local_19e0,'t',(string *)&neighbor,&threads,&local_19c8);
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = local_19e0;
  local_19e0 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  ppiVar2 = &gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)ppiVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gids,"memory","");
  local_1860._M_dataplus._M_p = (pointer)&local_1860.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1860,"maximum blocks to store in memory","");
  opts::Option<int>((opts *)&local_19e8,'m',(string *)&gids,&in_memory,&local_1860);
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = local_19e8;
  local_19e8 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_1880._M_dataplus._M_p = (pointer)&local_1880.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1880,"prefix","");
  local_17a0._M_dataplus._M_p = (pointer)&local_17a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_17a0,"prefix for external storage","");
  opts::Option<std::__cxx11::string>((opts *)&local_19f0,&local_1880,&prefix,&local_17a0);
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = local_19f0;
  local_19f0 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_17c0._M_dataplus._M_p = (pointer)&local_17c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_17c0,"help","");
  local_17e0._M_dataplus._M_p = (pointer)&local_17e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_17e0,"show help","");
  opts::Option<bool>((opts *)&local_19f8,'h',&local_17c0,&help,&local_17e0);
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = local_19f8;
  local_19f8 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       ops.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  if (local_19f8 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_19f8 + 8))();
  }
  local_19f8 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17e0._M_dataplus._M_p != &local_17e0.field_2) {
    operator_delete(local_17e0._M_dataplus._M_p,local_17e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17c0._M_dataplus._M_p != &local_17c0.field_2) {
    operator_delete(local_17c0._M_dataplus._M_p,local_17c0.field_2._M_allocated_capacity + 1);
  }
  if (local_19f0 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_19f0 + 8))();
  }
  local_19f0 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17a0._M_dataplus._M_p != &local_17a0.field_2) {
    operator_delete(local_17a0._M_dataplus._M_p,local_17a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1880._M_dataplus._M_p != &local_1880.field_2) {
    operator_delete(local_1880._M_dataplus._M_p,local_1880.field_2._M_allocated_capacity + 1);
  }
  if (local_19e8 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_19e8 + 8))();
  }
  local_19e8 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1860._M_dataplus._M_p != &local_1860.field_2) {
    operator_delete(local_1860._M_dataplus._M_p,local_1860.field_2._M_allocated_capacity + 1);
  }
  if ((pointer *)
      gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      ppiVar2) {
    operator_delete(gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (local_19e0 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_19e0 + 8))();
  }
  local_19e0 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_19c8._M_dataplus._M_p != &local_19c8.field_2) {
    operator_delete(local_19c8._M_dataplus._M_p,local_19c8.field_2._M_allocated_capacity + 1);
  }
  if (neighbor != (BlockID)local_1978) {
    operator_delete((void *)neighbor,local_1978._0_8_ + 1);
  }
  if (local_19d8 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_19d8 + 8))();
  }
  local_19d8 = (_List_node_base *)0x0;
  if ((pointer *)storage.super_ExternalStorage._vptr_ExternalStorage !=
      &storage.filename_templates_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(storage.super_ExternalStorage._vptr_ExternalStorage,
                    (ulong)((long)&((storage.filename_templates_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p
                           + 1));
  }
  if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  bVar4 = opts::Options::parse(&ops,argc,argv);
  if ((bVar4) && (help != true)) {
    storage.super_ExternalStorage._vptr_ExternalStorage = (_func_int **)&PTR_put_00144248;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&storage.filename_templates_,1,&prefix,(allocator_type *)&master);
    iVar5 = threads;
    iVar8 = in_memory;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    storage.filenames_.m_.mLock = 0;
    storage.max_size_.x_ = 0;
    storage.max_size_.m_.mLock = 0;
    storage.count_.x_ = 0;
    storage.count_.m_.mLock = 0;
    storage.current_size_.x_ = 0;
    storage.current_size_.m_.mLock = 0;
    local_1780.comm_.data = world.comm_.data;
    local_1780.rank_ = world.rank_;
    local_1780.size_ = world.size_;
    local_1780.owner_ = false;
    local_18c8.super__Function_base._M_functor._8_8_ = 0;
    local_18c8.super__Function_base._M_functor._M_unused._M_object = create_block;
    local_18c8._M_invoker = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
    local_18c8.super__Function_base._M_manager =
         std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
    local_18e8.super__Function_base._M_functor._8_8_ = 0;
    local_18e8.super__Function_base._M_functor._M_unused._M_object = destroy_block;
    local_18e8._M_invoker = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_18e8.super__Function_base._M_manager =
         std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    local_1908.super__Function_base._M_functor._8_8_ = 0;
    local_1908.super__Function_base._M_functor._M_unused._M_object = save_block;
    local_1908._M_invoker =
         std::
         _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
         ::_M_invoke;
    local_1908.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
         ::_M_manager;
    local_1928.super__Function_base._M_functor._8_8_ = 0;
    local_1928.super__Function_base._M_functor._M_unused._M_object = load_block;
    local_1928._M_invoker =
         std::
         _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
         ::_M_invoke;
    local_1928.super__Function_base._M_manager =
         std::
         _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
         ::_M_manager;
    storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    q_policy = (QueuePolicy *)operator_new(0x10);
    q_policy->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_001443e8;
    q_policy[1]._vptr_QueuePolicy = (_func_int **)0x1000;
    diy::Master::Master(&master,&local_1780,iVar5,iVar8,&local_18c8,&local_18e8,
                        &storage.super_ExternalStorage,&local_1908,&local_1928,q_policy);
    if (local_1928.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1928.super__Function_base._M_manager)
                ((_Any_data *)&local_1928,(_Any_data *)&local_1928,__destroy_functor);
    }
    if (local_1908.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1908.super__Function_base._M_manager)
                ((_Any_data *)&local_1908,(_Any_data *)&local_1908,__destroy_functor);
    }
    if (local_18e8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_18e8.super__Function_base._M_manager)
                ((_Any_data *)&local_18e8,(_Any_data *)&local_18e8,__destroy_functor);
    }
    if (local_18c8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_18c8.super__Function_base._M_manager)
                ((_Any_data *)&local_18c8,(_Any_data *)&local_18c8,__destroy_functor);
    }
    diy::mpi::communicator::~communicator(&local_1780);
    iVar8 = nblocks;
    local_1a00 = world.size_;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    neighbor.gid = world.rank_;
    if (world.rank_ < nblocks) {
      iVar5 = world.rank_;
      do {
        if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&gids,
                     (iterator)
                     gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&neighbor.gid);
        }
        else {
          *gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar5;
          gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar5 = neighbor.gid + local_1a00;
        neighbor.gid = iVar5;
      } while (iVar5 < iVar8);
    }
    if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        != gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start) {
      uVar9 = 0;
      do {
        iVar8 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar9];
        l = (Link *)operator_new(0x20);
        (l->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__00144440;
        (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (iVar8 < nblocks + -1) {
          neighbor.proc = (iVar8 + 1) % local_1a00;
          neighbor.gid = iVar8 + 1;
          iVar3._M_current =
               (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
            _M_realloc_insert<diy::BlockID_const&>
                      ((vector<diy::BlockID,std::allocator<diy::BlockID>> *)&l->neighbors_,iVar3,
                       &neighbor);
          }
          else {
            *iVar3._M_current = neighbor;
            ppBVar1 = &(l->neighbors_).
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppBVar1 = *ppBVar1 + 1;
          }
        }
        if (0 < iVar8) {
          neighbor.proc = (iVar8 + -1) % local_1a00;
          neighbor.gid = iVar8 + -1;
          iVar3._M_current =
               (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
            _M_realloc_insert<diy::BlockID_const&>
                      ((vector<diy::BlockID,std::allocator<diy::BlockID>> *)&l->neighbors_,iVar3,
                       &neighbor);
          }
          else {
            *iVar3._M_current = neighbor;
            ppBVar1 = &(l->neighbors_).
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppBVar1 = *ppBVar1 + 1;
          }
        }
        this = (vector<int,_std::allocator<int>_> *)operator_new(0x20);
        (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        iVar5 = 0;
        do {
          iVar6 = iVar8 * 3 + iVar5;
          local_19c8._M_dataplus._M_p._0_4_ = iVar6;
          __position._M_current =
               (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_finish;
          if (__position._M_current ==
              (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (this,__position,(int *)&local_19c8);
          }
          else {
            *__position._M_current = iVar6;
            (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != 3);
        diy::Master::add(&master,iVar8,this,l);
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (uVar9 < (ulong)((long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 2));
    }
    local_19c8._M_dataplus._M_p = (pointer)local_sum;
    neighbor.gid = 0;
    neighbor.proc = 0;
    local_1978._8_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_invoke;
    local_1978._0_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager
    ;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)&local_19c8,(Skip *)&neighbor);
    if ((code *)local_1978._0_8_ != (code *)0x0) {
      (*(code *)local_1978._0_8_)(&neighbor,&neighbor,3);
    }
    local_16c8._M_unused._M_object = (void *)0x0;
    local_16c8._8_8_ = 0;
    local_16a8._M_unused._M_object = (void *)0x0;
    local_16a8._8_8_ = 0;
    local_1688._M_unused._M_object = (void *)0x0;
    local_1688._8_8_ = 0;
    pcStack_16b0 = std::
                   _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                   ::_M_invoke;
    local_16b8 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    pcStack_1690 = std::
                   _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                   ::_M_invoke;
    local_1698 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    pcStack_1670 = std::
                   _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                   ::_M_invoke;
    local_1678 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    diy::Master::exchange(&master,false,(MemoryManagement *)&local_16c8);
    if (local_1678 != (code *)0x0) {
      (*local_1678)(&local_1688,&local_1688,__destroy_functor);
    }
    if (local_1698 != (code *)0x0) {
      (*local_1698)(&local_16a8,&local_16a8,__destroy_functor);
    }
    if (local_16b8 != (code *)0x0) {
      (*local_16b8)(&local_16c8,&local_16c8,__destroy_functor);
    }
    local_19c8._M_dataplus._M_p = (pointer)average_neighbors;
    neighbor.gid = 0;
    neighbor.proc = 0;
    local_1978._8_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_invoke;
    local_1978._0_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager
    ;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)&local_19c8,(Skip *)&neighbor);
    if ((code *)local_1978._0_8_ != (code *)0x0) {
      (*(code *)local_1978._0_8_)(&neighbor,&neighbor,3);
    }
    local_19c8._M_dataplus._M_p = (pointer)&local_19c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_19c8,"blocks.out","");
    neighbor = (BlockID)&PTR__MemoryBuffer_00144538;
    local_1978._0_8_ = (void *)0x0;
    local_1978._8_8_ = 0;
    pcStack_1968 = (pointer)0x0;
    local_1960 = 0;
    vStack_1958.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_1958.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_1958.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1768._M_unused._M_object = (void *)0x0;
    local_1768._8_8_ = 0;
    local_1758 = (code *)0x0;
    uStack_1750 = 0;
    diy::io::write_blocks
              (&local_19c8,&world,&master,(MemoryBuffer *)&neighbor,(SaveBlock *)&local_1768);
    if (local_1758 != (code *)0x0) {
      (*local_1758)(&local_1768,&local_1768,__destroy_functor);
    }
    neighbor = (BlockID)&PTR__MemoryBuffer_00144538;
    std::vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>::~vector(&vStack_1958);
    if ((void *)local_1978._0_8_ != (void *)0x0) {
      operator_delete((void *)local_1978._0_8_,(long)pcStack_1968 - local_1978._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_19c8._M_dataplus._M_p != &local_19c8.field_2) {
      operator_delete(local_19c8._M_dataplus._M_p,local_19c8.field_2._M_allocated_capacity + 1);
    }
    if (world.rank_ == 0) {
      local_1800._M_dataplus._M_p = (pointer)&local_1800.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1800,"");
      diy::stats::Profiler::output(&master.prof,(ostream *)&std::cout,&local_1800);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1800._M_dataplus._M_p != &local_1800.field_2) {
        operator_delete(local_1800._M_dataplus._M_p,local_1800.field_2._M_allocated_capacity + 1);
      }
    }
    if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        != (pointer)0x0) {
      operator_delete(gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    diy::Master::~Master(&master);
    diy::FileStorage::~FileStorage(&storage);
    iVar8 = 0;
  }
  else {
    iVar8 = 1;
    if (world.rank_ == 0) {
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  std::__cxx11::
  _List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ::_M_clear(&ops.options.
              super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
            );
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ops);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p,prefix.field_2._M_allocated_capacity + 1);
  }
  diy::mpi::communicator::~communicator(&world);
  MPI_Finalize();
  return iVar8;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv); // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator    world;           // equivalent of MPI_COMM_WORLD

    int                       nblocks   = 128; // global number of blocks
    int                       threads   = 4;   // allow diy 4 threads for multithreading blocks
    int                       in_memory = 8;   // allow diy to keep 8 local blocks in memory
    std::string               prefix    = "./DIY.XXXXXX"; // prefix for temp files for blocks
                                                          // moved out of core

    bool help;

    // get command line arguments
    using namespace opts;
    Options ops;
    ops
        >> Option('b', "blocks",  nblocks,        "number of blocks")
        >> Option('t', "thread",  threads,        "number of threads")
        >> Option('m', "memory",  in_memory,      "maximum blocks to store in memory")
        >> Option(     "prefix",  prefix,         "prefix for external storage")
        >> Option('h', "help",    help,           "show help")
        ;
    if (!ops.parse(argc,argv) || help)
    {
        if (world.rank() == 0)
            std::cout << ops;
        return 1;
    }

    // diy initialization
    diy::FileStorage          storage(prefix); // used for blocks to be moved out of core
    diy::Master               master(world,    // master is the diy top-level object
                                     threads,
                                     in_memory,
                                     &create_block,
                                     &destroy_block,
                                     &storage,
                                     &save_block,
                                     &load_block);

    // choice of contiguous or round robin assigner
    // diy::ContiguousAssigner   assigner(world.size(), nblocks);
    diy::RoundRobinAssigner   assigner(world.size(), nblocks);

    // this example creates a linear chain of blocks
    std::vector<int> gids;                     // global ids of local blocks
    assigner.local_gids(world.rank(), gids);   // get the gids of local blocks
    for (unsigned i = 0; i < gids.size(); ++i) // for the local blocks in this processor
    {
        int gid = gids[i];

        diy::Link*    link = new diy::Link;  // link is this block's neighborhood
        diy::BlockID  neighbor;
        if (gid < nblocks - 1)               // all but the last block in the global domain
        {
            neighbor.gid  = gid + 1;                     // gid of the neighbor block
            neighbor.proc = assigner.rank(neighbor.gid); // process of the neighbor block
            link->add_neighbor(neighbor);                // add the neighbor block to the link
        }
        if (gid > 0)                         // all but the first block in the global domain
        {
            neighbor.gid  = gid - 1;
            neighbor.proc = assigner.rank(neighbor.gid);
            link->add_neighbor(neighbor);
        }

        Block* b = new Block;                // create a new block
        // assign some values for the block
        // in this example, simply based on the block global id
        for (unsigned j = 0; j < 3; ++j)
            b->values.push_back(gid * 3 + j);

        master.add(gid, b, link);            // add the current local block to the master
    }

    // compute, exchange, compute
    master.foreach(&local_sum);          // callback function executed on each local block
    master.exchange();                   // exchange data between blocks in the link
    master.foreach(&average_neighbors);  // callback function executed on each local block

    // save the results in diy format
    diy::io::write_blocks("blocks.out", world, master);

    if (world.rank() == 0)
        master.prof.output(std::cout);
}